

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O0

void lj_crecord_tonumber(jit_State *J,RecordFFData *rd)

{
  uint uVar1;
  TRef TVar2;
  jit_State *pjVar3;
  cTValue *in_RSI;
  long in_RDI;
  CType *ct;
  CType *d;
  CTState *cts;
  jit_State *local_98;
  jit_State *in_stack_ffffffffffffff90;
  
  uVar1 = *(uint *)(in_RDI + -0xb4);
  pjVar3 = (jit_State *)
           lj_ctype_rawref((CTState *)(ulong)uVar1,(uint)*(ushort *)((ulong)*(uint *)*in_RSI + 6));
  local_98 = pjVar3;
  if ((pjVar3->cur).nextgc.gcptr32 >> 0x1c == 5) {
    local_98 = (jit_State *)
               (((CTState *)(ulong)uVar1)->tab + ((pjVar3->cur).nextgc.gcptr32 & 0xffff));
    in_stack_ffffffffffffff90 = pjVar3;
  }
  if (((local_98->cur).nextgc.gcptr32 >> 0x1c == 0) ||
     (((local_98->cur).nextgc.gcptr32 & 0xf4000000) == 0x34000000)) {
    TVar2 = crec_ct_tv((jit_State *)rd,(CType *)cts,d._4_4_,(TRef)d,(cTValue *)ct);
    **(TRef **)(in_RDI + 0x88) = TVar2;
  }
  else {
    argv2cdata(in_stack_ffffffffffffff90,(TRef)((ulong)in_RDI >> 0x20),in_RSI);
    **(undefined4 **)(in_RDI + 0x88) = 0x7fff;
  }
  return;
}

Assistant:

void LJ_FASTCALL lj_crecord_tonumber(jit_State *J, RecordFFData *rd)
{
  CTState *cts = ctype_ctsG(J2G(J));
  CType *d, *ct = lj_ctype_rawref(cts, cdataV(&rd->argv[0])->ctypeid);
  if (ctype_isenum(ct->info)) ct = ctype_child(cts, ct);
  if (ctype_isnum(ct->info) || ctype_iscomplex(ct->info)) {
    if (ctype_isinteger_or_bool(ct->info) && ct->size <= 4 &&
	!(ct->size == 4 && (ct->info & CTF_UNSIGNED)))
      d = ctype_get(cts, CTID_INT32);
    else
      d = ctype_get(cts, CTID_DOUBLE);
    J->base[0] = crec_ct_tv(J, d, 0, J->base[0], &rd->argv[0]);
  } else {
    /* Specialize to the ctype that couldn't be converted. */
    argv2cdata(J, J->base[0], &rd->argv[0]);
    J->base[0] = TREF_NIL;
  }
}